

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Resolution * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResolutionAtReturnTime
          (Resolution *__return_storage_ptr__,RpcServerResponseImpl *this,
          ArrayPtr<const_capnp::PipelineOp> ops)

{
  ArrayPtr<const_capnp::PipelineOp> ops_00;
  undefined1 local_88 [16];
  PointerBuilder local_78;
  Resolution *local_50;
  PointerBuilder local_48;
  
  ops_00.size_ = ops.ptr;
  local_78.pointer = (this->payload)._builder.pointers;
  local_78.segment = (this->payload)._builder.segment;
  local_78.capTable = (this->payload)._builder.capTable;
  local_50 = __return_storage_ptr__;
  PointerBuilder::imbue
            (&local_48,(PointerBuilder *)(local_88 + 0x10),&(this->capTable).super_CapTableBuilder);
  PointerBuilder::asReader(&local_48);
  ops_00.ptr = (PipelineOp *)(local_88 + 0x10);
  AnyPointer::Reader::getPipelinedCap((Reader *)local_88,ops_00);
  local_48.segment = (SegmentBuilder *)local_88._8_8_;
  kj::
  Table<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
  ::find<0ul,capnp::ClientHook*&>
            ((Table<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
              *)(local_88 + 0x10),(ClientHook **)&this->resolutionsAtReturnTime);
  if (local_78.segment == (SegmentBuilder *)0x0) {
    (*(code *)((SegmentReader *)local_88._8_8_)->arena[4]._vptr_Arena)(local_88 + 0x10);
  }
  else {
    (**(code **)((((local_78.segment)->super_SegmentReader).ptr.ptr)->content + 0x20))
              (local_88 + 0x10);
  }
  (local_50->returnedCap).disposer = (Disposer *)local_88._0_8_;
  (local_50->returnedCap).ptr = (ClientHook *)local_88._8_8_;
  (local_50->unwrapped).disposer = (Disposer *)local_78.segment;
  (local_50->unwrapped).ptr = (ClientHook *)local_78.capTable;
  return local_50;
}

Assistant:

Resolution getResolutionAtReturnTime(kj::ArrayPtr<const PipelineOp> ops) {
      auto returnedCap = getResultsBuilder().asReader().getPipelinedCap(ops);
      kj::Own<ClientHook> unwrapped;
      KJ_IF_SOME(u, resolutionsAtReturnTime.find(returnedCap.get())) {
        unwrapped = u->addRef();
      } else {
        unwrapped = returnedCap->addRef();
      }